

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O0

vector<long,_std::allocator<long>_> * __thiscall
DistanceGraph::get_prev_nodes(DistanceGraph *this,sgNodeID_t n)

{
  bool bVar1;
  reference pLVar2;
  size_type in_RDX;
  vector<long,_std::allocator<long>_> *in_RSI;
  size_type __n;
  vector<long,_std::allocator<long>_> *in_RDI;
  Link *l;
  const_iterator __end1;
  const_iterator __begin1;
  value_type *__range1;
  vector<long,_std::allocator<long>_> *r;
  vector<Link,_std::allocator<Link>_> *in_stack_ffffffffffffff88;
  vector<long,_std::allocator<long>_> *__args;
  __normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_> local_30;
  const_reference local_28;
  undefined1 local_19;
  size_type local_18;
  
  local_19 = 0;
  __args = in_RDI;
  local_18 = in_RDX;
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)0x38e7e4);
  __n = local_18;
  if ((long)local_18 < 1) {
    __n = -local_18;
  }
  local_28 = std::
             vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
             ::operator[]((vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                           *)&(in_RSI->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                              super__Vector_impl_data._M_finish,__n);
  local_30._M_current =
       (Link *)std::vector<Link,_std::allocator<Link>_>::begin(in_stack_ffffffffffffff88);
  std::vector<Link,_std::allocator<Link>_>::end(in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                             *)in_stack_ffffffffffffff88), bVar1) {
    pLVar2 = __gnu_cxx::__normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
             operator*(&local_30);
    if (pLVar2->source == local_18) {
      std::vector<long,_std::allocator<long>_>::emplace_back<long>(in_RSI,(long *)__args);
    }
    __gnu_cxx::__normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
    operator++(&local_30);
  }
  return __args;
}

Assistant:

std::vector<sgNodeID_t> DistanceGraph::get_prev_nodes(sgNodeID_t n) const {
    std::vector<sgNodeID_t > r;
    for (auto&  l:links[llabs(n)]) if (l.source==n) r.emplace_back(-l.dest);
    return r;
}